

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O0

bool __thiscall HighsSearch::orbitsValidInChildNode(HighsSearch *this,HighsDomainChange *branchChg)

{
  bool bVar1;
  const_reference pvVar2;
  long in_RSI;
  HighsDomain *in_RDI;
  NodeData *currNode;
  HighsInt branchCol;
  HighsInt in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  HighsDomain *this_00;
  
  uVar3 = *(undefined4 *)(in_RSI + 8);
  this_00 = in_RDI;
  pvVar2 = std::vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>::back
                     ((vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_> *)
                      in_RDI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pvVar2->stabilizerOrbits);
  if (bVar1) {
    std::__shared_ptr_access<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x68f237);
    bVar1 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(uVar3,in_stack_ffffffffffffffe0));
    if (!bVar1) {
      std::__shared_ptr_access<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x68f251);
      bVar1 = StabilizerOrbits::isStabilized
                        ((StabilizerOrbits *)this_00,(HighsInt)((ulong)in_RSI >> 0x20));
      if (!bVar1) {
        if ((*(int *)(in_RSI + 0xc) == 1) &&
           (bVar1 = HighsDomain::isGlobalBinary(in_RDI,in_stack_ffffffffffffffcc), bVar1)) {
          return true;
        }
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool HighsSearch::orbitsValidInChildNode(
    const HighsDomainChange& branchChg) const {
  HighsInt branchCol = branchChg.column;
  // if the variable is integral or we are in an up branch the stabilizer only
  // stays valid if the column has been stabilized
  const NodeData& currNode = nodestack.back();
  if (!currNode.stabilizerOrbits ||
      currNode.stabilizerOrbits->orbitCols.empty() ||
      currNode.stabilizerOrbits->isStabilized(branchCol))
    return true;

  // a down branch stays valid if the variable is binary
  if (branchChg.boundtype == HighsBoundType::kUpper &&
      localdom.isGlobalBinary(branchChg.column))
    return true;

  return false;
}